

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O1

int cm_zlib_gzeof(gzFile file)

{
  int iVar1;
  
  iVar1 = 0;
  if ((file != (gzFile)0x0) && (iVar1 = 0, file[1].have == 0x1c4f)) {
    iVar1 = *(int *)((long)&file[3].next + 4);
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzeof(gzFile file) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return 0;

    /* return end-of-file state */
    return state->mode == GZ_READ ? state->past : 0;
}